

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ImGuiIO *pIVar2;
  ImGuiStyle *pIVar3;
  uint *puVar4;
  type *ptVar5;
  undefined8 uVar6;
  ImDrawData *__stat_loc;
  char *in_RSI;
  int in_EDI;
  string *this;
  float fVar7;
  ImDrawData *drawData;
  double dVar8;
  double dVar9;
  type *client;
  type *cid;
  iterator __end2_1;
  iterator __begin2_1;
  map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
  *__range2_1;
  ImGuiIO *io;
  Event *event;
  iterator __end2;
  iterator __begin2;
  deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *__range2;
  deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> events;
  State state;
  VSync vsync;
  int height;
  int width;
  uchar *pixels;
  ImGuiWS imguiWS;
  string httpRoot;
  int port;
  _Self *__y;
  float in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  int32_t in_stack_fffffffffffffbec;
  ImDrawData *in_stack_fffffffffffffbf0;
  uchar **in_stack_fffffffffffffbf8;
  ImFontAtlas *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  uint in_stack_fffffffffffffc0c;
  ImFontAtlas *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  iterator in_stack_fffffffffffffc18;
  ImGuiIO *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc30;
  State *in_stack_fffffffffffffc60;
  string *data;
  undefined1 *puVar10;
  ImGuiWS *this_00;
  _Self local_300;
  iterator in_stack_fffffffffffffd08;
  State *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  undefined1 local_2c1 [33];
  string local_2a0 [32];
  string local_280 [32];
  ImVec2 local_260;
  ImVec2 local_258;
  ImVec2 local_250;
  ImVec2 local_248;
  ImGuiIO *local_240;
  reference local_238;
  _Deque_iterator<ImGuiWS::Event,_ImGuiWS::Event_&,_ImGuiWS::Event_*> local_210;
  undefined1 *local_1f0;
  undefined1 local_1e8 [80];
  byte local_198;
  float local_190;
  undefined1 local_180 [148];
  undefined1 local_ec;
  undefined1 local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string *local_e8;
  string local_e0 [32];
  ImGuiWS local_c0 [4];
  string *local_a0;
  undefined8 local_98;
  ImGuiStyle *in_stack_ffffffffffffff70;
  string local_78 [32];
  ImGuiWS local_58 [3];
  allocator<char> local_39;
  string local_38 [28];
  ImGuiWindowFlags in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar11;
  uint uVar12;
  
  printf("Usage: %s [port] [http-root]\n",*(undefined8 *)in_RSI);
  uVar11 = 5000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  std::allocator<char>::~allocator(&local_39);
  if (1 < in_EDI) {
    uVar11 = atoi(*(char **)(in_RSI + 8));
  }
  if (2 < in_EDI) {
    std::__cxx11::string::operator=(local_38,*(char **)(in_RSI + 0x10));
  }
  __y = (_Self *)0x2;
  ImGui::DebugCheckVersionAndDataLayout
            ((char *)in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8,
             (size_t)in_stack_fffffffffffffbf0,
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),2,
             (size_t)in_stack_fffffffffffffc10);
  ImGui::CreateContext(in_stack_fffffffffffffc10);
  pIVar2 = ImGui::GetIO();
  pIVar2->MouseDrawCursor = true;
  ImGui::StyleColorsDark(in_stack_ffffffffffffff70);
  pIVar3 = ImGui::GetStyle();
  pIVar3->AntiAliasedFill = false;
  pIVar3 = ImGui::GetStyle();
  pIVar3->AntiAliasedLines = false;
  pIVar3 = ImGui::GetStyle();
  pIVar3->WindowRounding = 0.0;
  pIVar3 = ImGui::GetStyle();
  pIVar3->ScrollbarRounding = 0.0;
  ImGuiWS::ImGuiWS((ImGuiWS *)in_stack_fffffffffffffbf0);
  uVar12 = uVar11;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (char *)in_stack_fffffffffffffc00);
  local_eb = 1;
  local_e8 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  this_00 = local_c0;
  local_e8 = (string *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  local_eb = 0;
  local_a0 = local_e0;
  local_98 = 2;
  puVar10 = &local_ec;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10d0fd);
  __l._M_len = (size_type)in_stack_fffffffffffffc20;
  __l._M_array = in_stack_fffffffffffffc18;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc10,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  ImGuiWS::init(local_58,(EVP_PKEY_CTX *)(ulong)uVar11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbf0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10d164);
  data = local_e0;
  this = (string *)&local_a0;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != data);
  std::allocator<char>::~allocator(&local_ea);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string(local_78);
  ImGui::GetIO();
  ImFontAtlas::GetTexDataAsAlpha8
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0,
             (int *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (int *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  ImGuiWS::setTexture(this_00,(TextureId)((ulong)puVar10 >> 0x20),(Type)puVar10,
                      (int32_t)((ulong)this >> 0x20),(int32_t)this,(char *)data);
  VSync::VSync((VSync *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),(double)__y);
  State::State((State *)in_stack_fffffffffffffc10);
  do {
    ImGuiWS::takeEvents((ImGuiWS *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    local_1f0 = local_1e8;
    std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::begin
              ((deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)__y);
    std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::end
              ((deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)__y);
    while( true ) {
      bVar1 = std::operator!=((_Self *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                              ,__y);
      if (!bVar1) break;
      local_238 = std::_Deque_iterator<ImGuiWS::Event,_ImGuiWS::Event_&,_ImGuiWS::Event_*>::
                  operator*(&local_210);
      State::handle(in_stack_fffffffffffffd10,(Event *)in_stack_fffffffffffffd08._M_node);
      std::_Deque_iterator<ImGuiWS::Event,_ImGuiWS::Event_&,_ImGuiWS::Event_*>::operator++
                ((_Deque_iterator<ImGuiWS::Event,_ImGuiWS::Event_&,_ImGuiWS::Event_*> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    }
    State::update(in_stack_fffffffffffffc60);
    local_240 = ImGui::GetIO();
    ImVec2::ImVec2(&local_248,1200.0,800.0);
    local_240->DisplaySize = local_248;
    fVar7 = VSync::delta_s((VSync *)in_stack_fffffffffffffbf0);
    local_240->DeltaTime = fVar7;
    ImGui::NewFrame();
    if ((local_198 & 1) != 0) {
      ImGui::ShowDemoWindow((bool *)in_stack_fffffffffffffc20);
    }
    ImGui::Begin(in_RSI,(bool *)CONCAT44(uVar12,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
                );
    ImGui::Checkbox(in_stack_fffffffffffffd18,&in_stack_fffffffffffffd10->showDemoWindow);
    pIVar2 = ImGui::GetIO();
    drawData = (ImDrawData *)(double)(1000.0 / pIVar2->Framerate);
    in_stack_fffffffffffffc20 = ImGui::GetIO();
    ImGui::Text(&drawData->Valid,(double)in_stack_fffffffffffffc20->Framerate,
                "Application average %.3f ms/frame (%.1f FPS)");
    ImGui::End();
    ImVec2::ImVec2(&local_250,10.0,10.0);
    ImVec2::ImVec2(&local_258,0.0,0.0);
    ImGui::SetNextWindowPos(&local_250,1,&local_258);
    ImVec2::ImVec2(&local_260,400.0,300.0);
    ImGui::SetNextWindowSize(&local_260,1);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc20,&drawData->Valid,(allocator<char> *)__rhs);
    std::
    map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
    ::size((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
            *)0x10d697);
    std::__cxx11::to_string((unsigned_long)drawData);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)drawData,
                   __rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    std::__cxx11::string::c_str();
    ImGui::Begin(in_RSI,(bool *)CONCAT44(uVar12,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
                );
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
    std::__cxx11::string::~string((string *)(local_2c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2c1);
    ImGui::Text(" Id   Ip addr");
    in_stack_fffffffffffffd10 = (State *)local_180;
    in_stack_fffffffffffffd08 =
         std::
         map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         ::begin((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                  *)__y);
    local_300._M_node =
         (_Base_ptr)
         std::
         map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         ::end((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                *)__y);
    while( true ) {
      bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffd08,&local_300);
      if (!bVar1) break;
      std::_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_>::operator*
                ((_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_> *)0x10d7c0);
      puVar4 = (uint *)std::get<0ul,int_const,State::ClientData>
                                 ((pair<const_int,_State::ClientData> *)0x10d7d5);
      ptVar5 = std::get<1ul,int_const,State::ClientData>
                         ((pair<const_int,_State::ClientData> *)0x10d7ea);
      in_stack_fffffffffffffc0c = *puVar4;
      uVar6 = std::__cxx11::string::c_str();
      ImGui::Text("%3d : %s",(ulong)in_stack_fffffffffffffc0c,uVar6);
      if ((ptVar5->hasControl & 1U) != 0) {
        ImGui::SameLine(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0);
        dVar8 = (double)local_190;
        dVar9 = ImGui::GetTime();
        ImGui::TextDisabled((char *)(dVar8 - dVar9)," [has control for %4.2f seconds]");
      }
      std::_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    }
    ImGui::End();
    ImGui::Render();
    __stat_loc = ImGui::GetDrawData();
    in_stack_fffffffffffffbf0 = __stat_loc;
    ImGuiWS::setDrawData((ImGuiWS *)in_stack_fffffffffffffc20,drawData);
    do {
      VSync::wait((VSync *)(local_180 + 0x68),__stat_loc);
      in_stack_fffffffffffffbec = ImGuiWS::nConnected((ImGuiWS *)0x10d9a7);
    } while (in_stack_fffffffffffffbec == 0);
    std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::~deque
              ((deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)
               CONCAT44(fVar7,in_stack_fffffffffffffc30));
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s [port] [http-root]\n", argv[0]);

    int port = 5000;
    std::string httpRoot = "../examples";

    if (argc > 1) port = atoi(argv[1]);
    if (argc > 2) httpRoot = argv[2];

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGui::GetIO().MouseDrawCursor = true;

    ImGui::StyleColorsDark();
    ImGui::GetStyle().AntiAliasedFill = false;
    ImGui::GetStyle().AntiAliasedLines = false;
    ImGui::GetStyle().WindowRounding = 0.0f;
    ImGui::GetStyle().ScrollbarRounding = 0.0f;

    // setup imgui-ws
    ImGuiWS imguiWS;
    imguiWS.init(port, httpRoot + "/demo-null", { "", "index.html" });

    // prepare font texture
    {
        unsigned char * pixels;
        int width, height;
        ImGui::GetIO().Fonts->GetTexDataAsAlpha8(&pixels, &width, &height);
        imguiWS.setTexture(0, ImGuiWS::Texture::Type::Alpha8, width, height, (const char *) pixels);
    }

    VSync vsync;
    State state;

    while (true) {
        // websocket event handling
        auto events = imguiWS.takeEvents();
        for (auto & event : events) {
            state.handle(std::move(event));
        }
        state.update();

        {
            auto & io = ImGui::GetIO();
            io.DisplaySize = ImVec2(1200, 800);
            io.DeltaTime = vsync.delta_s();
        }

        ImGui::NewFrame();

        // render stuff
        if (state.showDemoWindow) {
            ImGui::ShowDemoWindow(&state.showDemoWindow);
        }

        // debug window
        {
            ImGui::Begin("Hello, world!");
            ImGui::Checkbox("Demo Window", &state.showDemoWindow);
            ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
            ImGui::End();
        }

        // show connected clients
        ImGui::SetNextWindowPos({ 10, 10 } , ImGuiCond_Always);
        ImGui::SetNextWindowSize({ 400, 300 } , ImGuiCond_Always);
        ImGui::Begin((std::string("WebSocket clients (") + std::to_string(state.clients.size()) + ")").c_str(), nullptr, ImGuiWindowFlags_NoCollapse);
        ImGui::Text(" Id   Ip addr");
        for (auto & [ cid, client ] : state.clients) {
            ImGui::Text("%3d : %s", cid, client.ip.c_str());
            if (client.hasControl) {
                ImGui::SameLine();
                ImGui::TextDisabled(" [has control for %4.2f seconds]", state.tControlNext_s - ImGui::GetTime());
            }
        }
        ImGui::End();

        // generate ImDrawData
        ImGui::Render();

        // store ImDrawData for asynchronous dispatching to WS clients
        imguiWS.setDrawData(ImGui::GetDrawData());

        // if not clients are connected, just sleep to save CPU
        do {
            vsync.wait();
        } while (imguiWS.nConnected() == 0);
    }

    ImGui::DestroyContext();

    return 0;
}